

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
::EqualElement<char[17]>::operator()
          (EqualElement<char[17]> *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          piecewise_construct_t *param_2,
          tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *param_3,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *param_4)

{
  size_t __n;
  char *__s1;
  char *__s;
  int iVar1;
  size_t sVar2;
  size_type __rlen;
  bool bVar3;
  
  __n = lhs->_M_len;
  __s1 = lhs->_M_str;
  __s = *(char **)this;
  sVar2 = strlen(__s);
  if (__n == sVar2) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(__s1,__s,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }